

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_spec.cpp
# Opt level: O1

void P_PlayerOnSpecialFlat(player_t *player,int floorType)

{
  AInventory *pAVar1;
  AInventory *pAVar2;
  PClass *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  PClass *pPVar5;
  bool bVar6;
  FSoundID local_40;
  FName local_3c;
  DAngle local_38;
  
  if ((Terrains.Array[floorType].DamageAmount != 0) &&
     ((level.time & Terrains.Array[floorType].DamageTimeMask) == 0)) {
    if (Terrains.Array[floorType].AllowProtection == true) {
      pAVar1 = (player->mo->super_AActor).Inventory.field_0.p;
      pPVar3 = APowerIronFeet::RegistrationInfo.MyClass;
      if ((pAVar1 != (AInventory *)0x0) &&
         (((pAVar1->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
        (player->mo->super_AActor).Inventory.field_0.p = (AInventory *)0x0;
        pAVar1 = (AInventory *)0x0;
        pPVar3 = APowerIronFeet::RegistrationInfo.MyClass;
      }
      while (pAVar2 = pAVar1, APowerIronFeet::RegistrationInfo.MyClass = pPVar3,
            pAVar2 != (AInventory *)0x0) {
        if ((pAVar2->super_AActor).super_DThinker.super_DObject.Class == (PClass *)0x0) {
          iVar4 = (**(pAVar2->super_AActor).super_DThinker.super_DObject._vptr_DObject)(pAVar2);
          (pAVar2->super_AActor).super_DThinker.super_DObject.Class =
               (PClass *)CONCAT44(extraout_var,iVar4);
        }
        pPVar5 = (pAVar2->super_AActor).super_DThinker.super_DObject.Class;
        bVar6 = pPVar5 != (PClass *)0x0;
        if (pPVar5 != pPVar3 && bVar6) {
          do {
            pPVar5 = pPVar5->ParentClass;
            bVar6 = pPVar5 != (PClass *)0x0;
            if (pPVar5 == pPVar3) break;
          } while (pPVar5 != (PClass *)0x0);
        }
        if (bVar6) {
          return;
        }
        pAVar1 = (pAVar2->super_AActor).Inventory.field_0.p;
        pPVar3 = APowerIronFeet::RegistrationInfo.MyClass;
        if ((pAVar1 != (AInventory *)0x0) &&
           (((pAVar1->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
          (pAVar2->super_AActor).Inventory.field_0.p = (AInventory *)0x0;
          pAVar1 = (AInventory *)0x0;
          pPVar3 = APowerIronFeet::RegistrationInfo.MyClass;
        }
      }
    }
    local_3c.Index = Terrains.Array[floorType].DamageMOD.Index;
    local_38.Degrees = 0.0;
    iVar4 = P_DamageMobj(&player->mo->super_AActor,(AActor *)0x0,(AActor *)0x0,
                         Terrains.Array[floorType].DamageAmount,&local_3c,0,&local_38);
    if ((0 < iVar4) && ((long)Terrains.Array[floorType].Splash != -1)) {
      local_40.ID = Splashes.Array[Terrains.Array[floorType].Splash].NormalSplashSound.ID;
      S_Sound(&player->mo->super_AActor,0,&local_40,1.0,1.001);
    }
  }
  return;
}

Assistant:

void P_PlayerOnSpecialFlat (player_t *player, int floorType)
{
	if (Terrains[floorType].DamageAmount &&
		!(level.time & Terrains[floorType].DamageTimeMask))
	{
		AInventory *ironfeet = NULL;

		if (Terrains[floorType].AllowProtection)
		{
			for (ironfeet = player->mo->Inventory; ironfeet != NULL; ironfeet = ironfeet->Inventory)
			{
				if (ironfeet->IsKindOf (RUNTIME_CLASS(APowerIronFeet)))
					break;
			}
		}

		int damage = 0;
		if (ironfeet == NULL)
		{
			damage = P_DamageMobj (player->mo, NULL, NULL, Terrains[floorType].DamageAmount,
				Terrains[floorType].DamageMOD);
		}
		if (damage > 0 && Terrains[floorType].Splash != -1)
		{
			S_Sound (player->mo, CHAN_AUTO,
				Splashes[Terrains[floorType].Splash].NormalSplashSound, 1,
				ATTN_IDLE);
		}
	}
}